

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result spvc_compiler_build_combined_image_samplers(spvc_compiler compiler)

{
  pointer this;
  exception *e;
  spvc_compiler compiler_local;
  
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::Compiler::build_combined_image_samplers(this);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_build_combined_image_samplers(spvc_compiler compiler)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		compiler->compiler->build_combined_image_samplers();
	}